

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O2

void linffind(lindef *lin,char *buf,objnum *objp,uint *ofsp)

{
  ushort uVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  uint unaff_R15D;
  uint32_t tmp;
  bool bVar9;
  mcmon local_6a;
  ulong local_68;
  char *local_60;
  
  uVar2 = *(uint *)buf;
  local_6a = 0xffff;
  local_68 = 0;
  pcVar7 = (char *)0x0;
  local_60 = lin[2].linbuf + -1;
  while( true ) {
    lVar8 = (long)local_60 - (long)pcVar7;
    if ((long)local_60 < (long)pcVar7) {
      *objp = local_6a;
      *ofsp = (uint)local_68;
      *(uint *)buf = unaff_R15D;
      return;
    }
    pcVar6 = pcVar7 + lVar8 / 2;
    uVar5 = (ulong)pcVar6 >> 9 & 0x1fffffffe;
    puVar3 = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)&lin[1].linrenp + uVar5));
    uVar4 = (ulong)((uint)pcVar6 & 0x3ff);
    local_6a = *(mcmon *)(puVar3 + uVar4 * 4);
    uVar1 = *(ushort *)(puVar3 + uVar4 * 4 + 2);
    local_68 = (ulong)uVar1;
    mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)&lin[1].linrenp + uVar5));
    puVar3 = mcmlck((mcmcxdef *)lin[1].linofsp,local_6a);
    unaff_R15D = *(uint *)(puVar3 + local_68 + 5);
    mcmunlck((mcmcxdef *)lin[1].linofsp,local_6a);
    if (unaff_R15D == uVar2) break;
    if (unaff_R15D < uVar2) {
      pcVar7 = pcVar7 + 1;
      if (2 < lVar8 + 1U) {
        pcVar7 = pcVar6;
      }
    }
    else {
      bVar9 = pcVar6 != local_60;
      local_60 = local_60 + -1;
      if (bVar9) {
        local_60 = pcVar6;
      }
    }
  }
  *objp = local_6a;
  *ofsp = (uint)uVar1;
  return;
}

Assistant:

void linffind(lindef *lin, char *buf, objnum *objp, uint *ofsp)
{
#   define  linf ((linfdef *)lin)
    uint    pg;
    uchar  *objptr;
    uchar  *bufptr;
    long    first;
    long    last;
    long    cur;
    ulong   seekpos;
    ulong   curpos;
    objnum  objn;
    uint    ofs;

    /* get desired seek position out of buffer */
    seekpos = osrp4(buf);

    /* we haven't traversed any records yet */
    objn = MCMONINV;
    ofs = 0;
    
    /* run a binary search for the indicated line record */
    first = 0;
    last = linf->linfcrec - 1;
    for (;;)
    {
        /* make sure we're not out of records entirely */
        if (first > last)
        {
            /* return the most recent record found - it's closest */
            *objp = objn;
            *ofsp = ofs;

            /* set the position to that of the line we actually found */
            oswp4(buf, curpos);
            return;
        }

        /* split the difference */
        cur = first + (last - first)/2;

        /* calculate the page containing this item */
        pg = cur >> 10;
        
        /* get object + offset corresponding to current source line */
        objptr = mcmlck(linf->linfmem, linf->linfpg[pg]);
        bufptr = objptr + ((cur & 1023) * DBGLINFSIZ);
        objn = osrp2(bufptr);
        ofs = osrp2(bufptr + 2);
        mcmunlck(linf->linfmem, linf->linfpg[pg]);

        /* read user data out of the object's OPCLINE record */
        objptr = mcmlck(linf->linfmem, (mcmon)objn);
        bufptr = objptr + ofs + 5;
        curpos = osrp4(bufptr);
        mcmunlck(linf->linfmem, (mcmon)objn);

        /* see what we have */
        if (curpos == seekpos)
        {
            *objp = objn;
            *ofsp = ofs;
            return;
        }
        else if (curpos < seekpos)
            first = (cur == first ? first + 1 : cur);
        else
            last = (cur == last ? last - 1 : cur);
    }
    
#   undef linf
}